

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O2

void KDict_Add(KonohaContext *kctx,KDict *dict,KKeyValue *kvs)

{
  char *pcVar1;
  ulong uVar2;
  anon_union_8_4_5585e3e3_for_KKeyValue_2 aVar3;
  
  uVar2 = (dict->data).bytesize;
  KDict_Ensure(kctx,dict,1);
  aVar3 = kvs->field_2;
  pcVar1 = (dict->data).field_1.bytebuf + (uVar2 & 0xfffffffffffffff0);
  *(undefined8 *)pcVar1 = *(undefined8 *)kvs;
  *(anon_union_8_4_5585e3e3_for_KKeyValue_2 *)(pcVar1 + 8) = aVar3;
  (dict->data).bytesize = (dict->data).bytesize + 0x10;
  if (8 < (uVar2 >> 4) - dict->sortedData) {
    KDict_Sort(kctx,dict);
    return;
  }
  return;
}

Assistant:

KLIBDECL void KDict_Add(KonohaContext *kctx, KDict *dict, KKeyValue *kvs)
{
	size_t size = KDict_size(dict);
	KDict_Ensure(kctx, dict, 1);
	memcpy(dict->data.keyValueItems + size, kvs, sizeof(KKeyValue));
	dict->data.bytesize += sizeof(KKeyValue);
	if(size - dict->sortedData > 8) {
		KDict_Sort(kctx, dict);
	}
}